

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

float duckdb::Cast::Operation<duckdb::dtime_t,float>(dtime_t input)

{
  bool bVar1;
  InvalidInputException *this;
  PhysicalType type;
  PhysicalType type_00;
  float result;
  string local_118;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = TryCast::Operation<duckdb::dtime_t,float>(input,&result,false);
  if (bVar1) {
    return result;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  TypeIdToString_abi_cxx11_(&local_d8,(duckdb *)0x9,type);
  ::std::operator+(&local_b8,"Type ",&local_d8);
  ::std::operator+(&local_98,&local_b8," with value ");
  ConvertToString::Operation<duckdb::dtime_t>(&local_f8,input);
  ::std::operator+(&local_78,&local_98,&local_f8);
  ::std::operator+(&local_58,&local_78," can\'t be cast to the destination type ");
  TypeIdToString_abi_cxx11_(&local_118,(duckdb *)0xb,type_00);
  ::std::operator+(&local_38,&local_58,&local_118);
  ::std::__cxx11::string::~string((string *)&local_118);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  InvalidInputException::InvalidInputException(this,&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}